

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes.c
# Opt level: O1

int subb_a_imm(em8051 *aCPU)

{
  byte bVar1;
  
  bVar1 = aCPU->mSFR[0x50];
  sub_solve_flags(aCPU,(uint)aCPU->mSFR[0x60],
                  (uint)aCPU->mCodeMem[(long)aCPU->mCodeMemSize - 1U & (long)aCPU->mPC + 1U] +
                  (uint)(bVar1 >> 7));
  aCPU->mSFR[0x60] =
       aCPU->mSFR[0x60] +
       (((char)bVar1 >> 7) - aCPU->mCodeMem[(long)aCPU->mCodeMemSize - 1U & (long)aCPU->mPC + 1U]);
  aCPU->mPC = aCPU->mPC + 2;
  return 0;
}

Assistant:

static int subb_a_imm(struct em8051 *aCPU)
{
    int carry = CARRY;
    sub_solve_flags(aCPU, ACC, OPERAND1 + carry);
    ACC -= OPERAND1 + carry;
    PC += 2;
    return 0;
}